

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Numbering.hpp
# Opt level: O0

ostream * Lib::operator<<(ostream *out,Numbering<Kernel::Literal_*,_1U> *self)

{
  ostream *poVar1;
  Numbering<Kernel::Literal_*,_1U> *this;
  Literal *pLVar2;
  long in_RSI;
  ostream *in_RDI;
  uint i;
  undefined8 in_stack_ffffffffffffffd8;
  uint local_14;
  
  std::operator<<(in_RDI,"{");
  if (1 < *(uint *)(in_RSI + 0x50)) {
    poVar1 = (ostream *)std::ostream::operator<<(in_RDI,1);
    this = (Numbering<Kernel::Literal_*,_1U> *)std::operator<<(poVar1," -> ");
    pLVar2 = Numbering<Kernel::Literal_*,_1U>::obj
                       (this,(uint)((ulong)in_stack_ffffffffffffffd8 >> 0x20));
    std::ostream::operator<<(this,pLVar2);
    for (local_14 = 2; local_14 < *(uint *)(in_RSI + 0x50); local_14 = local_14 + 1) {
      poVar1 = std::operator<<(in_RDI,", ");
      poVar1 = (ostream *)std::ostream::operator<<(poVar1,local_14);
      poVar1 = std::operator<<(poVar1," -> ");
      pLVar2 = Numbering<Kernel::Literal_*,_1U>::obj(this,(uint)((ulong)poVar1 >> 0x20));
      std::ostream::operator<<(poVar1,pLVar2);
    }
  }
  poVar1 = std::operator<<(in_RDI,"}");
  return poVar1;
}

Assistant:

std::ostream& operator<<(std::ostream& out, Numbering const& self)
  { 
    out << "{";
    if (Start < self._nextNum) {
      out << Start << " -> " << self.obj(Start);
      for (unsigned i = Start + 1; i < self._nextNum; i++) {
        out << ", " << i << " -> " << self.obj(i);
      }
    }
    return out << "}";
  }